

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O0

jvirt_barray_ptr
request_virt_barray(j_common_ptr cinfo,int pool_id,boolean pre_zero,JDIMENSION blocksperrow,
                   JDIMENSION numrows,JDIMENSION maxaccess)

{
  long lVar1;
  jvirt_barray_ptr pjVar2;
  JDIMENSION in_ECX;
  boolean in_EDX;
  int in_ESI;
  long *in_RDI;
  JDIMENSION in_R8D;
  JDIMENSION in_R9D;
  j_common_ptr unaff_retaddr;
  jvirt_barray_ptr result;
  my_mem_ptr mem;
  
  lVar1 = in_RDI[1];
  if (in_ESI != 1) {
    *(undefined4 *)(*in_RDI + 0x28) = 0xe;
    *(int *)(*in_RDI + 0x2c) = in_ESI;
    (**(code **)*in_RDI)(in_RDI);
  }
  pjVar2 = (jvirt_barray_ptr)
           alloc_small(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),CONCAT44(in_ESI,in_EDX));
  pjVar2->mem_buffer = (JBLOCKARRAY)0x0;
  pjVar2->rows_in_array = in_R8D;
  pjVar2->blocksperrow = in_ECX;
  pjVar2->maxaccess = in_R9D;
  pjVar2->pre_zero = in_EDX;
  pjVar2->b_s_open = 0;
  pjVar2->next = *(jvirt_barray_ptr *)(lVar1 + 0x90);
  *(jvirt_barray_ptr *)(lVar1 + 0x90) = pjVar2;
  return pjVar2;
}

Assistant:

METHODDEF(jvirt_barray_ptr)
request_virt_barray(j_common_ptr cinfo, int pool_id, boolean pre_zero,
                    JDIMENSION blocksperrow, JDIMENSION numrows,
                    JDIMENSION maxaccess)
/* Request a virtual 2-D coefficient-block array */
{
  my_mem_ptr mem = (my_mem_ptr)cinfo->mem;
  jvirt_barray_ptr result;

  /* Only IMAGE-lifetime virtual arrays are currently supported */
  if (pool_id != JPOOL_IMAGE)
    ERREXIT1(cinfo, JERR_BAD_POOL_ID, pool_id); /* safety check */

  /* get control block */
  result = (jvirt_barray_ptr)alloc_small(cinfo, pool_id,
                                         sizeof(struct jvirt_barray_control));

  result->mem_buffer = NULL;    /* marks array not yet realized */
  result->rows_in_array = numrows;
  result->blocksperrow = blocksperrow;
  result->maxaccess = maxaccess;
  result->pre_zero = pre_zero;
  result->b_s_open = FALSE;     /* no associated backing-store object */
  result->next = mem->virt_barray_list; /* add to list of virtual arrays */
  mem->virt_barray_list = result;

  return result;
}